

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TraceBuffer::CopyChunkUntrusted
          (TraceBuffer *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,uint16_t num_fragments,
          uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  bool bVar1;
  bool bVar2;
  size_t sz;
  pointer ppVar3;
  pointer ppVar4;
  char *fname;
  size_t bytes_to_clear;
  ssize_t sVar5;
  uint64_t uVar6;
  ChunkRecord *pCVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  mapped_type *pmVar10;
  BufferStats *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>,_bool>
  pVar11;
  ChunkID *last_chunk_id;
  _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
  _Stack_e8;
  pair<unsigned_short,_unsigned_short> producer_and_writer_id;
  ChunkMeta local_d8;
  _Base_ptr local_c0;
  pair<std::_Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>,_bool>
  it_and_inserted;
  size_t padding_size;
  ssize_t del_res;
  ssize_t res;
  size_t cached_size_to_end;
  uint8_t *wptr;
  _Self local_80;
  iterator subsequent_it;
  Key subsequent_key;
  ChunkRecord *prev;
  ChunkMeta *record_meta;
  _Self local_50;
  iterator it;
  Key key;
  ChunkRecord record;
  size_t record_size;
  WriterID WStack_1e;
  bool chunk_complete_local;
  ChunkID chunk_id_local;
  uid_t uStack_18;
  WriterID writer_id_local;
  pid_t producer_pid_trusted_local;
  uid_t producer_uid_trusted_local;
  ProducerID producer_id_trusted_local;
  TraceBuffer *this_local;
  
  WStack_1e = writer_id;
  chunk_id_local = producer_pid_trusted;
  uStack_18 = producer_uid_trusted;
  producer_pid_trusted_local._2_2_ = producer_id_trusted;
  _producer_uid_trusted_local = this;
  sz = perfetto::base::AlignUp<16ul>(size + 0x10);
  if (this->max_chunk_size_ < sz) {
    uVar6 = protos::gen::TraceStats_BufferStats::abi_violations(&this->stats_);
    protos::gen::TraceStats_BufferStats::set_abi_violations(&this->stats_,uVar6 + 1);
  }
  else {
    if ((((chunk_complete ^ 0xffU) & 1) != 0) && (num_fragments != 0)) {
      num_fragments = num_fragments - 1;
      chunk_flags = chunk_flags & 0xf9;
    }
    ChunkRecord::ChunkRecord((ChunkRecord *)&key,sz);
    key.chunk_id._0_2_ = producer_pid_trusted_local._2_2_;
    key.chunk_id._2_2_ = WStack_1e;
    key._0_4_ = chunk_id;
    ChunkMeta::Key::Key((Key *)&it,(ChunkRecord *)&key);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
         ::find(&this->index_,(key_type *)&it);
    record_meta = (ChunkMeta *)
                  std::
                  map<perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
                  ::end(&this->index_);
    bVar1 = std::operator!=(&local_50,(_Self *)&record_meta);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
               ::operator->(&local_50);
      pCVar7 = (ppVar3->second).chunk_record;
      ChunkMeta::Key::Key(&subsequent_key,pCVar7);
      bVar2 = ChunkMeta::Key::operator!=(&subsequent_key,(Key *)&it);
      bVar1 = true;
      if (((!bVar2) && (bVar1 = true, pCVar7->size == sz)) &&
         (bVar1 = true, pCVar7->num_fragments <= num_fragments)) {
        bVar1 = (pCVar7->field_0xc & 0x3f & chunk_flags) != (pCVar7->field_0xc & 0x3f);
      }
      if (bVar1) {
        uVar6 = protos::gen::TraceStats_BufferStats::abi_violations(&this->stats_);
        protos::gen::TraceStats_BufferStats::set_abi_violations(&this->stats_,uVar6 + 1);
      }
      else if (pCVar7->num_fragments != num_fragments) {
        subsequent_it._M_node._4_4_ = (int)((ulong)it._M_node >> 0x20);
        subsequent_it._M_node._0_4_ = SUB84(it._M_node,0);
        subsequent_it._M_node._4_4_ = subsequent_it._M_node._4_4_ + 1;
        local_80._M_node =
             (_Base_ptr)
             std::
             map<perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
             ::find(&this->index_,(key_type *)&subsequent_it);
        wptr = (uint8_t *)
               std::
               map<perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta,_std::less<perfetto::TraceBuffer::ChunkMeta::Key>,_std::allocator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>_>
               ::end(&this->index_);
        bVar2 = std::operator!=(&local_80,(_Self *)&wptr);
        bVar1 = false;
        if (bVar2) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
                   ::operator->(&local_80);
          bVar1 = (ppVar4->second).num_fragments_read != 0;
        }
        if (bVar1) {
          uVar6 = protos::gen::TraceStats_BufferStats::abi_violations(&this->stats_);
          protos::gen::TraceStats_BufferStats::set_abi_violations(&this->stats_,uVar6 + 1);
        }
        else if (pCVar7->num_fragments < (ppVar3->second).num_fragments_read) {
          fname = perfetto::base::Basename
                            (
                            "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                            );
          perfetto::base::LogMessage
                    (kLogError,fname,0xc33a,
                     "TraceBuffer read too many fragments from an incomplete chunk");
        }
        else {
          (ppVar3->second).num_fragments = num_fragments;
          (ppVar3->second).flags = chunk_flags;
          ChunkMeta::set_complete(&ppVar3->second,chunk_complete);
          WriteChunkRecord(this,(uint8_t *)pCVar7,(ChunkRecord *)&key,src,size);
          uVar6 = protos::gen::TraceStats_BufferStats::chunks_rewritten(&this->stats_);
          protos::gen::TraceStats_BufferStats::set_chunks_rewritten(&this->stats_,uVar6 + 1);
        }
      }
    }
    else if ((this->discard_writes_ & 1U) == 0) {
      bytes_to_clear = size_to_end(this);
      if (bytes_to_clear < sz) {
        sVar5 = DeleteNextChunksFor(this,bytes_to_clear);
        if (sVar5 == -1) {
          DiscardWrite(this);
          return;
        }
        AddPaddingRecord(this,bytes_to_clear);
        puVar9 = begin(this);
        this->wptr_ = puVar9;
        uVar6 = protos::gen::TraceStats_BufferStats::write_wrap_count(&this->stats_);
        protos::gen::TraceStats_BufferStats::set_write_wrap_count(&this->stats_,uVar6 + 1);
      }
      it_and_inserted._8_8_ = DeleteNextChunksFor(this,sz);
      if (it_and_inserted._8_8_ == -1) {
        DiscardWrite(this);
      }
      else {
        this_00 = &this->stats_;
        uVar6 = protos::gen::TraceStats_BufferStats::chunks_written(this_00);
        protos::gen::TraceStats_BufferStats::set_chunks_written(this_00,uVar6 + 1);
        uVar6 = protos::gen::TraceStats_BufferStats::bytes_written(this_00);
        protos::gen::TraceStats_BufferStats::set_bytes_written(this_00,uVar6 + sz);
        pCVar7 = GetChunkRecordAt(this,this->wptr_);
        ChunkMeta::ChunkMeta
                  (&local_d8,pCVar7,num_fragments,chunk_complete,chunk_flags,uStack_18,
                   chunk_id_local);
        pVar11 = ::std::
                 map<perfetto::TraceBuffer::ChunkMeta::Key,perfetto::TraceBuffer::ChunkMeta,std::less<perfetto::TraceBuffer::ChunkMeta::Key>,std::allocator<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>>
                 ::emplace<perfetto::TraceBuffer::ChunkMeta::Key&,perfetto::TraceBuffer::ChunkMeta>
                           ((map<perfetto::TraceBuffer::ChunkMeta::Key,perfetto::TraceBuffer::ChunkMeta,std::less<perfetto::TraceBuffer::ChunkMeta::Key>,std::allocator<std::pair<perfetto::TraceBuffer::ChunkMeta::Key_const,perfetto::TraceBuffer::ChunkMeta>>>
                             *)&this->index_,(Key *)&it,&local_d8);
        _Stack_e8 = pVar11.first._M_node;
        it_and_inserted.first._M_node._0_1_ = pVar11.second;
        local_c0 = _Stack_e8._M_node;
        WriteChunkRecord(this,this->wptr_,(ChunkRecord *)&key,src,size);
        this->wptr_ = this->wptr_ + sz;
        puVar9 = this->wptr_;
        puVar8 = end(this);
        if (puVar8 <= puVar9) {
          puVar9 = begin(this);
          this->wptr_ = puVar9;
          uVar6 = protos::gen::TraceStats_BufferStats::write_wrap_count(&this->stats_);
          protos::gen::TraceStats_BufferStats::set_write_wrap_count(&this->stats_,uVar6 + 1);
        }
        DcheckIsAlignedAndWithinBounds(this,this->wptr_);
        last_chunk_id._4_4_ =
             ::std::make_pair<unsigned_short&,unsigned_short&>
                       ((unsigned_short *)((long)&producer_pid_trusted_local + 2),
                        &stack0xffffffffffffffe2);
        pmVar10 = std::
                  map<std::pair<unsigned_short,_unsigned_short>,_unsigned_int,_std::less<std::pair<unsigned_short,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_short,_unsigned_short>,_unsigned_int>_>_>
                  ::operator[](&this->last_chunk_id_written_,(key_type *)((long)&last_chunk_id + 4))
        ;
        if (chunk_id - *pmVar10 < 0x7fffffff) {
          *pmVar10 = chunk_id;
        }
        else {
          uVar6 = protos::gen::TraceStats_BufferStats::chunks_committed_out_of_order(&this->stats_);
          protos::gen::TraceStats_BufferStats::set_chunks_committed_out_of_order
                    (&this->stats_,uVar6 + 1);
        }
        if (it_and_inserted._8_8_ != 0) {
          AddPaddingRecord(this,it_and_inserted._8_8_);
        }
      }
    }
    else {
      DiscardWrite(this);
    }
  }
  return;
}

Assistant:

void TraceBuffer::CopyChunkUntrusted(ProducerID producer_id_trusted,
                                     uid_t producer_uid_trusted,
                                     pid_t producer_pid_trusted,
                                     WriterID writer_id,
                                     ChunkID chunk_id,
                                     uint16_t num_fragments,
                                     uint8_t chunk_flags,
                                     bool chunk_complete,
                                     const uint8_t* src,
                                     size_t size) {
  // |record_size| = |size| + sizeof(ChunkRecord), rounded up to avoid to end
  // up in a fragmented state where size_to_end() < sizeof(ChunkRecord).
  const size_t record_size =
      base::AlignUp<sizeof(ChunkRecord)>(size + sizeof(ChunkRecord));
  if (PERFETTO_UNLIKELY(record_size > max_chunk_size_)) {
    stats_.set_abi_violations(stats_.abi_violations() + 1);
    PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
    return;
  }

  TRACE_BUFFER_DLOG("CopyChunk @ %lu, size=%zu", wptr_ - begin(), record_size);

#if PERFETTO_DCHECK_IS_ON()
  changed_since_last_read_ = true;
#endif

  // If the chunk hasn't been completed, we should only consider the first
  // |num_fragments - 1| packets complete. For simplicity, we simply disregard
  // the last one when we copy the chunk.
  if (PERFETTO_UNLIKELY(!chunk_complete)) {
    if (num_fragments > 0) {
      num_fragments--;
      // These flags should only affect the last packet in the chunk. We clear
      // them, so that TraceBuffer is able to look at the remaining packets in
      // this chunk.
      chunk_flags &= ~kLastPacketContinuesOnNextChunk;
      chunk_flags &= ~kChunkNeedsPatching;
    }
  }

  ChunkRecord record(record_size);
  record.producer_id = producer_id_trusted;
  record.chunk_id = chunk_id;
  record.writer_id = writer_id;
  record.num_fragments = num_fragments;
  record.flags = chunk_flags;
  ChunkMeta::Key key(record);

  // Check whether we have already copied the same chunk previously. This may
  // happen if the service scrapes chunks in a potentially incomplete state
  // before receiving commit requests for them from the producer. Note that the
  // service may scrape and thus override chunks in arbitrary order since the
  // chunks aren't ordered in the SMB.
  const auto it = index_.find(key);
  if (PERFETTO_UNLIKELY(it != index_.end())) {
    ChunkMeta* record_meta = &it->second;
    ChunkRecord* prev = record_meta->chunk_record;

    // Verify that the old chunk's metadata corresponds to the new one.
    // Overridden chunks should never change size, since the page layout is
    // fixed per writer. The number of fragments should also never decrease and
    // flags should not be removed.
    if (PERFETTO_UNLIKELY(ChunkMeta::Key(*prev) != key ||
                          prev->size != record_size ||
                          prev->num_fragments > num_fragments ||
                          (prev->flags & chunk_flags) != prev->flags)) {
      stats_.set_abi_violations(stats_.abi_violations() + 1);
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    // If this chunk was previously copied with the same number of fragments and
    // the number didn't change, there's no need to copy it again. If the
    // previous chunk was complete already, this should always be the case.
    PERFETTO_DCHECK(suppress_client_dchecks_for_testing_ ||
                    !record_meta->is_complete() ||
                    (chunk_complete && prev->num_fragments == num_fragments));
    if (prev->num_fragments == num_fragments) {
      TRACE_BUFFER_DLOG("  skipping recommit of identical chunk");
      return;
    }

    // If we've already started reading from chunk N+1 following this chunk N,
    // don't override chunk N. Otherwise we may end up reading a packet from
    // chunk N after having read from chunk N+1, thereby violating sequential
    // read of packets. This shouldn't happen if the producer is well-behaved,
    // because it shouldn't start chunk N+1 before completing chunk N.
    ChunkMeta::Key subsequent_key = key;
    static_assert(std::numeric_limits<ChunkID>::max() == kMaxChunkID,
                  "ChunkID wraps");
    subsequent_key.chunk_id++;
    const auto subsequent_it = index_.find(subsequent_key);
    if (subsequent_it != index_.end() &&
        subsequent_it->second.num_fragments_read > 0) {
      stats_.set_abi_violations(stats_.abi_violations() + 1);
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    // We should not have read past the last packet.
    if (record_meta->num_fragments_read > prev->num_fragments) {
      PERFETTO_ELOG(
          "TraceBuffer read too many fragments from an incomplete chunk");
      PERFETTO_DCHECK(suppress_client_dchecks_for_testing_);
      return;
    }

    uint8_t* wptr = reinterpret_cast<uint8_t*>(prev);
    TRACE_BUFFER_DLOG("  overriding chunk @ %lu, size=%zu", wptr - begin(),
                      record_size);

    // Update chunk meta data stored in the index, as it may have changed.
    record_meta->num_fragments = num_fragments;
    record_meta->flags = chunk_flags;
    record_meta->set_complete(chunk_complete);

    // Override the ChunkRecord contents at the original |wptr|.
    TRACE_BUFFER_DLOG("  copying @ [%lu - %lu] %zu", wptr - begin(),
                      uintptr_t(wptr - begin()) + record_size, record_size);
    WriteChunkRecord(wptr, record, src, size);
    TRACE_BUFFER_DLOG("Chunk raw: %s",
                      base::HexDump(wptr, record_size).c_str());
    stats_.set_chunks_rewritten(stats_.chunks_rewritten() + 1);
    return;
  }

  if (PERFETTO_UNLIKELY(discard_writes_))
    return DiscardWrite();

  // If there isn't enough room from the given write position. Write a padding
  // record to clear the end of the buffer and wrap back.
  const size_t cached_size_to_end = size_to_end();
  if (PERFETTO_UNLIKELY(record_size > cached_size_to_end)) {
    ssize_t res = DeleteNextChunksFor(cached_size_to_end);
    if (res == -1)
      return DiscardWrite();
    PERFETTO_DCHECK(static_cast<size_t>(res) <= cached_size_to_end);
    AddPaddingRecord(cached_size_to_end);
    wptr_ = begin();
    stats_.set_write_wrap_count(stats_.write_wrap_count() + 1);
    PERFETTO_DCHECK(size_to_end() >= record_size);
  }

  // At this point either |wptr_| points to an untouched part of the buffer
  // (i.e. *wptr_ == 0) or we are about to overwrite one or more ChunkRecord(s).
  // In the latter case we need to first figure out where the next valid
  // ChunkRecord is (if it exists) and add padding between the new record.
  // Example ((w) == write cursor):
  //
  // Initial state (wtpr_ == 0):
  // |0 (w)    |10               |30                  |50
  // +---------+-----------------+--------------------+--------------------+
  // | Chunk 1 | Chunk 2         | Chunk 3            | Chunk 4            |
  // +---------+-----------------+--------------------+--------------------+
  //
  // Let's assume we now want now write a 5th Chunk of size == 35. The final
  // state should look like this:
  // |0                                |35 (w)         |50
  // +---------------------------------+---------------+--------------------+
  // | Chunk 5                         | Padding Chunk | Chunk 4            |
  // +---------------------------------+---------------+--------------------+

  // Deletes all chunks from |wptr_| to |wptr_| + |record_size|.
  ssize_t del_res = DeleteNextChunksFor(record_size);
  if (del_res == -1)
    return DiscardWrite();
  size_t padding_size = static_cast<size_t>(del_res);

  // Now first insert the new chunk. At the end, if necessary, add the padding.
  stats_.set_chunks_written(stats_.chunks_written() + 1);
  stats_.set_bytes_written(stats_.bytes_written() + record_size);
  auto it_and_inserted = index_.emplace(
      key, ChunkMeta(GetChunkRecordAt(wptr_), num_fragments, chunk_complete,
                     chunk_flags, producer_uid_trusted, producer_pid_trusted));
  PERFETTO_DCHECK(it_and_inserted.second);
  TRACE_BUFFER_DLOG("  copying @ [%lu - %lu] %zu", wptr_ - begin(),
                    uintptr_t(wptr_ - begin()) + record_size, record_size);
  WriteChunkRecord(wptr_, record, src, size);
  TRACE_BUFFER_DLOG("Chunk raw: %s", base::HexDump(wptr_, record_size).c_str());
  wptr_ += record_size;
  if (wptr_ >= end()) {
    PERFETTO_DCHECK(padding_size == 0);
    wptr_ = begin();
    stats_.set_write_wrap_count(stats_.write_wrap_count() + 1);
  }
  DcheckIsAlignedAndWithinBounds(wptr_);

  // Chunks may be received out of order, so only update last_chunk_id if the
  // new chunk_id is larger. But take into account overflows by only selecting
  // the new ID if its distance to the latest ID is smaller than half the number
  // space.
  //
  // This accounts for both the case where the new ID has just overflown and
  // last_chunk_id be updated even though it's smaller (e.g. |chunk_id| = 1 and
  // |last_chunk_id| = kMaxChunkId; chunk_id - last_chunk_id = 0) and the case
  // where the new ID is an out-of-order ID right after an overflow and
  // last_chunk_id shouldn't be updated even though it's larger (e.g. |chunk_id|
  // = kMaxChunkId and |last_chunk_id| = 1; chunk_id - last_chunk_id =
  // kMaxChunkId - 1).
  auto producer_and_writer_id = std::make_pair(producer_id_trusted, writer_id);
  ChunkID& last_chunk_id = last_chunk_id_written_[producer_and_writer_id];
  static_assert(std::numeric_limits<ChunkID>::max() == kMaxChunkID,
                "This code assumes that ChunkID wraps at kMaxChunkID");
  if (chunk_id - last_chunk_id < kMaxChunkID / 2) {
    last_chunk_id = chunk_id;
  } else {
    stats_.set_chunks_committed_out_of_order(
        stats_.chunks_committed_out_of_order() + 1);
  }

  if (padding_size)
    AddPaddingRecord(padding_size);
}